

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExeCommander.cpp
# Opt level: O1

char cmd_util::addrTypeToChar(addr_type type)

{
  char cVar1;
  
  cVar1 = '_';
  if (type < 4) {
    cVar1 = (char)(0x5676725f >> ((char)type * '\b' & 0x1fU));
  }
  return cVar1;
}

Assistant:

char cmd_util::addrTypeToChar(Executable::addr_type type)
{
    switch (type) {
        case Executable::RAW: return 'r';
        case Executable::RVA: return 'v';
        case Executable::VA: return 'V';
        default:
            return '_';
    }
    return '_';
}